

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::SampledImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  VkFormat format;
  SourceCollections *this;
  bool isUint;
  undefined1 isSint;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ProgramSources *pPVar6;
  TextureFormat TVar7;
  ostream *poVar8;
  int iVar9;
  ulong uVar10;
  char *__s;
  CaseDef *pCVar11;
  char *pcVar12;
  ulong uVar13;
  string refClearColor;
  string texelFormatStr;
  string refPrimitiveColor;
  string samplerTypeStr;
  ostringstream src;
  undefined1 auStack_2c8 [11];
  undefined1 local_2bd;
  uint local_2bc;
  CaseDef *local_2b8;
  string local_2b0;
  string local_290;
  undefined8 local_270;
  value_type local_268;
  string local_248;
  SourceCollections *local_228;
  long *local_220;
  long local_218;
  long local_210 [2];
  string local_200;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long local_1c0 [14];
  ios_base local_150 [264];
  CaseDef local_48;
  
  local_48.renderSize.m_data = *&(caseDef->renderSize).m_data;
  local_48.numLayers = caseDef->numLayers;
  local_48.colorFormat = caseDef->colorFormat;
  local_48.numSamples = caseDef->numSamples;
  addSimpleVertexAndFragmentPrograms(programCollection,&local_48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_1c0[0] + -0x18) + 0x108);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"layout(location = 0) in  vec4  in_position;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"    vec4 gl_Position;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"    gl_Position = in_position;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sample_vert","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_290);
  local_2b8 = caseDef;
  std::__cxx11::stringbuf::str();
  local_270 = (ulong)local_270._4_4_ << 0x20;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + (local_270 & 0xffffffff),&local_268);
  pCVar11 = local_2b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_228 = programCollection;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  TVar7 = ::vk::mapVkFormat(pCVar11->colorFormat);
  local_2bc = tcu::getNumUsedChannels(TVar7.order);
  isUint = ::vk::isUintFormat(pCVar11->colorFormat);
  isSint = ::vk::isIntFormat(pCVar11->colorFormat);
  pcVar4 = "vec4";
  if ((bool)isSint) {
    pcVar4 = "ivec4";
  }
  pcVar12 = "uvec4";
  if (!isUint) {
    pcVar12 = pcVar4;
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  sVar5 = strlen(pcVar12);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,pcVar12,pcVar12 + sVar5);
  format = pCVar11->colorFormat;
  bVar3 = ::vk::isUintFormat(format);
  if (bVar3) {
    local_268._M_dataplus._M_p = (pointer)0x6000000040;
    local_270 = 0x2000000010;
  }
  else {
    bVar3 = ::vk::isIntFormat(format);
    local_268._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    if (bVar3) {
      local_268._M_dataplus._M_p = (pointer)0x6000000040;
    }
    local_270 = 0x2000000010;
    if (!bVar3) {
      local_270 = 0;
    }
  }
  if (isUint) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    local_2bd = isSint;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"u",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"vec4(",5);
    if (0 < (int)local_2bc) {
      uVar10 = (ulong)local_2bc;
      uVar13 = 0;
      do {
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
        pcVar4 = "";
        if (uVar13 < 3) {
          pcVar4 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar4,(ulong)((uint)(uVar13 < 3) * 2));
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    pCVar11 = local_2b8;
    if ((int)local_2bc < 4) {
      iVar9 = 4 - local_2bc;
      do {
        poVar8 = (ostream *)std::ostream::operator<<(local_1c0,(uint)(iVar9 == 1));
        pcVar4 = ", ";
        if (iVar9 == 1) {
          pcVar4 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar4,(ulong)((uint)(iVar9 != 1) * 2));
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,")",1);
    std::__cxx11::stringbuf::str();
  }
  else {
    if (!(bool)isSint) {
      getColorStr<float>(&local_2b0,(float *)&local_270,local_2bc,false,false);
      goto LAB_004cd60b;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    local_2bd = isSint;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"i",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"vec4(",5);
    if (0 < (int)local_2bc) {
      uVar10 = (ulong)local_2bc;
      uVar13 = 0;
      do {
        poVar8 = (ostream *)
                 std::ostream::operator<<(local_1c0,*(int *)((long)&local_270 + uVar13 * 4));
        pcVar4 = "";
        if (uVar13 < 3) {
          pcVar4 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar4,(ulong)((uint)(uVar13 < 3) * 2));
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    pCVar11 = local_2b8;
    if ((int)local_2bc < 4) {
      iVar9 = 4 - local_2bc;
      do {
        poVar8 = (ostream *)std::ostream::operator<<(local_1c0,(uint)(iVar9 == 1));
        pcVar4 = ", ";
        if (iVar9 == 1) {
          pcVar4 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar4,(ulong)((uint)(iVar9 != 1) * 2));
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,")",1);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  isSint = local_2bd;
LAB_004cd60b:
  local_1c0[0] = 0x3f800000;
  local_1c0[1] = 0x3f80000000000000;
  getColorStr<float>(&local_248,(float *)local_1c0,local_2bc,isUint,(bool)isSint);
  piVar2 = &pCVar11->numLayers;
  iVar9 = *piVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  pcVar4 = "i";
  pcVar12 = "";
  if ((bool)isSint == false) {
    pcVar4 = "";
  }
  __s = "u";
  if (!isUint) {
    __s = pcVar4;
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"sampler2DMS",0xb);
  if (1 < iVar9) {
    pcVar12 = "Array";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,pcVar12,(ulong)(1 < iVar9) * 5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  this = local_228;
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_1c0[0] + -0x18) + 0x108);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"layout(location = 0) out int o_status;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"layout(set = 0, binding = 0) uniform ",0x25);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c0,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," colorTexture;\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    int checksum = 0;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if (*piVar2 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"    for (int sampleNdx = 0; sampleNdx < ",0x28);
    poVar8 = (ostream *)std::ostream::operator<<(local_1c0,local_2b8->numSamples);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++sampleNdx) {\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        ",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_290._M_dataplus._M_p,local_290._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n",0x46
              );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        if (color == ",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," || color == ",0xd);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"            ++checksum;\n",0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"    for (int layerNdx = 0; layerNdx < ",0x26);
    poVar8 = (ostream *)std::ostream::operator<<(local_1c0,*piVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++layerNdx)\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    for (int sampleNdx = 0; sampleNdx < ",0x28);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_2b8->numSamples);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++sampleNdx) {\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        ",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_290._M_dataplus._M_p,local_290._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n",
               0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        if (color == ",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," || color == ",0xd);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"            ++checksum;\n",0x18);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"    o_status = checksum;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"sample_frag","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_200);
  std::__cxx11::stringbuf::str();
  local_270 = CONCAT44(local_270._4_4_,1);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_220,local_218 + (long)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + (local_270 & 0xffffffff),&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base(local_150);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Pass 1: Render to texture

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Pass 2: Sample texture

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4  in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const int			numComponents		= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
		const bool			isUint				= isUintFormat(caseDef.colorFormat);
		const bool			isSint				= isIntFormat(caseDef.colorFormat);
		const std::string	texelFormatStr		= (isUint ? "uvec4" : isSint ? "ivec4" : "vec4");
		const std::string	refClearColor		= getReferenceClearColorStr(caseDef.colorFormat, numComponents, isUint, isSint);
		const std::string	refPrimitiveColor	= getReferencePrimitiveColorStr(numComponents, isUint, isSint);
		const std::string	samplerTypeStr		= getSamplerTypeStr(caseDef.numLayers, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out int o_status;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0) uniform " << samplerTypeStr << " colorTexture;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int checksum = 0;\n"
			<< "\n";

		if (caseDef.numLayers == 1)
			src << "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";
		else
			src << "    for (int layerNdx = 0; layerNdx < " << caseDef.numLayers << "; ++layerNdx)\n"
				<< "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";

		src << "\n"
			<< "    o_status = checksum;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_frag") << glu::FragmentSource(src.str());
	}
}